

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_read_mct(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  opj_simple_mcc_decorrelation_data_t *poVar1;
  opj_mct_data_t *poVar2;
  OPJ_BYTE *pOVar3;
  opj_tcp_t *local_68;
  opj_simple_mcc_decorrelation_data_t *l_mcc_record;
  opj_mct_data_t *new_mct_records;
  opj_mct_data_t *l_mct_data;
  OPJ_UINT32 l_indix;
  OPJ_UINT32 l_tmp;
  opj_tcp_t *l_tcp;
  opj_event_mgr_t *poStack_30;
  OPJ_UINT32 i;
  opj_event_mgr_t *p_manager_local;
  OPJ_BYTE *pOStack_20;
  OPJ_UINT32 p_header_size_local;
  OPJ_BYTE *p_header_data_local;
  opj_j2k_t *p_j2k_local;
  
  _l_indix = (opj_tcp_t *)0x0;
  poStack_30 = p_manager;
  p_manager_local._4_4_ = p_header_size;
  pOStack_20 = p_header_data;
  p_header_data_local = (OPJ_BYTE *)p_j2k;
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x15df,
                  "OPJ_BOOL opj_j2k_read_mct(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k != (opj_j2k_t *)0x0) {
    if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
      local_68 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
    }
    else {
      local_68 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
    }
    _l_indix = local_68;
    if (p_header_size < 2) {
      opj_event_msg(p_manager,1,"Error reading MCT marker\n");
      p_j2k_local._4_4_ = 0;
    }
    else {
      opj_read_bytes_LE(p_header_data,(OPJ_UINT32 *)((long)&l_mct_data + 4),2);
      pOStack_20 = pOStack_20 + 2;
      if (l_mct_data._4_4_ == 0) {
        if (p_manager_local._4_4_ < 7) {
          opj_event_msg(poStack_30,1,"Error reading MCT marker\n");
          p_j2k_local._4_4_ = 0;
        }
        else {
          opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)((long)&l_mct_data + 4),2);
          pOStack_20 = pOStack_20 + 2;
          l_mct_data._0_4_ = l_mct_data._4_4_ & 0xff;
          new_mct_records = _l_indix->m_mct_records;
          l_tcp._4_4_ = 0;
          for (; (l_tcp._4_4_ < _l_indix->m_nb_mct_records &&
                 (new_mct_records->m_index != (uint)l_mct_data));
              new_mct_records = new_mct_records + 1) {
            l_tcp._4_4_ = l_tcp._4_4_ + 1;
          }
          if (l_tcp._4_4_ == _l_indix->m_nb_mct_records) {
            if (_l_indix->m_nb_mct_records == _l_indix->m_nb_max_mct_records) {
              _l_indix->m_nb_max_mct_records = _l_indix->m_nb_max_mct_records + 10;
              poVar2 = (opj_mct_data_t *)
                       opj_realloc(_l_indix->m_mct_records,
                                   (ulong)_l_indix->m_nb_max_mct_records << 5);
              if (poVar2 == (opj_mct_data_t *)0x0) {
                opj_free(_l_indix->m_mct_records);
                _l_indix->m_mct_records = (opj_mct_data_t *)0x0;
                _l_indix->m_nb_max_mct_records = 0;
                _l_indix->m_nb_mct_records = 0;
                opj_event_msg(poStack_30,1,"Not enough memory to read MCT marker\n");
                return 0;
              }
              if (poVar2 != _l_indix->m_mct_records) {
                for (l_tcp._4_4_ = 0; l_tcp._4_4_ < _l_indix->m_nb_mcc_records;
                    l_tcp._4_4_ = l_tcp._4_4_ + 1) {
                  poVar1 = _l_indix->m_mcc_records;
                  if (poVar1[l_tcp._4_4_].m_decorrelation_array != (opj_mct_data_t *)0x0) {
                    poVar1[l_tcp._4_4_].m_decorrelation_array =
                         poVar2 + ((long)poVar1[l_tcp._4_4_].m_decorrelation_array -
                                   (long)_l_indix->m_mct_records >> 5);
                  }
                  if (poVar1[l_tcp._4_4_].m_offset_array != (opj_mct_data_t *)0x0) {
                    poVar1[l_tcp._4_4_].m_offset_array =
                         poVar2 + ((long)poVar1[l_tcp._4_4_].m_offset_array -
                                   (long)_l_indix->m_mct_records >> 5);
                  }
                }
              }
              _l_indix->m_mct_records = poVar2;
              memset(_l_indix->m_mct_records + _l_indix->m_nb_mct_records,0,
                     (ulong)(_l_indix->m_nb_max_mct_records - _l_indix->m_nb_mct_records) << 5);
            }
            new_mct_records = _l_indix->m_mct_records + _l_indix->m_nb_mct_records;
            _l_indix->m_nb_mct_records = _l_indix->m_nb_mct_records + 1;
          }
          if (new_mct_records->m_data != (OPJ_BYTE *)0x0) {
            opj_free(new_mct_records->m_data);
            new_mct_records->m_data = (OPJ_BYTE *)0x0;
            new_mct_records->m_data_size = 0;
          }
          new_mct_records->m_index = (uint)l_mct_data;
          new_mct_records->m_array_type =
               l_mct_data._4_4_ >> 8 & (MCT_TYPE_OFFSET|MCT_TYPE_DECORRELATION);
          new_mct_records->m_element_type = l_mct_data._4_4_ >> 10 & MCT_TYPE_DOUBLE;
          opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)((long)&l_mct_data + 4),2);
          pOStack_20 = pOStack_20 + 2;
          if (l_mct_data._4_4_ == 0) {
            p_manager_local._4_4_ = p_manager_local._4_4_ - 6;
            pOVar3 = (OPJ_BYTE *)opj_malloc((ulong)p_manager_local._4_4_);
            new_mct_records->m_data = pOVar3;
            if (new_mct_records->m_data == (OPJ_BYTE *)0x0) {
              opj_event_msg(poStack_30,1,"Error reading MCT marker\n");
              p_j2k_local._4_4_ = 0;
            }
            else {
              memcpy(new_mct_records->m_data,pOStack_20,(ulong)p_manager_local._4_4_);
              new_mct_records->m_data_size = p_manager_local._4_4_;
              p_j2k_local._4_4_ = 1;
            }
          }
          else {
            opj_event_msg(poStack_30,2,"Cannot take in charge multiple MCT markers\n");
            p_j2k_local._4_4_ = 1;
          }
        }
      }
      else {
        opj_event_msg(poStack_30,2,"Cannot take in charge mct data within multiple MCT records\n");
        p_j2k_local._4_4_ = 1;
      }
    }
    return p_j2k_local._4_4_;
  }
  __assert_fail("p_j2k != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x15e0,
                "OPJ_BOOL opj_j2k_read_mct(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)")
  ;
}

Assistant:

static OPJ_BOOL opj_j2k_read_mct(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager
                                )
{
    OPJ_UINT32 i;
    opj_tcp_t *l_tcp = 00;
    OPJ_UINT32 l_tmp;
    OPJ_UINT32 l_indix;
    opj_mct_data_t * l_mct_data;

    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);

    l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
            &p_j2k->m_cp.tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;

    if (p_header_size < 2) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCT marker\n");
        return OPJ_FALSE;
    }

    /* first marker */
    opj_read_bytes(p_header_data, &l_tmp, 2);                       /* Zmct */
    p_header_data += 2;
    if (l_tmp != 0) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Cannot take in charge mct data within multiple MCT records\n");
        return OPJ_TRUE;
    }

    if (p_header_size <= 6) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCT marker\n");
        return OPJ_FALSE;
    }

    /* Imct -> no need for other values, take the first, type is double with decorrelation x0000 1101 0000 0000*/
    opj_read_bytes(p_header_data, &l_tmp, 2);                       /* Imct */
    p_header_data += 2;

    l_indix = l_tmp & 0xff;
    l_mct_data = l_tcp->m_mct_records;

    for (i = 0; i < l_tcp->m_nb_mct_records; ++i) {
        if (l_mct_data->m_index == l_indix) {
            break;
        }
        ++l_mct_data;
    }

    /* NOT FOUND */
    if (i == l_tcp->m_nb_mct_records) {
        if (l_tcp->m_nb_mct_records == l_tcp->m_nb_max_mct_records) {
            opj_mct_data_t *new_mct_records;
            l_tcp->m_nb_max_mct_records += OPJ_J2K_MCT_DEFAULT_NB_RECORDS;

            new_mct_records = (opj_mct_data_t *) opj_realloc(l_tcp->m_mct_records,
                              l_tcp->m_nb_max_mct_records * sizeof(opj_mct_data_t));
            if (! new_mct_records) {
                opj_free(l_tcp->m_mct_records);
                l_tcp->m_mct_records = NULL;
                l_tcp->m_nb_max_mct_records = 0;
                l_tcp->m_nb_mct_records = 0;
                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read MCT marker\n");
                return OPJ_FALSE;
            }

            /* Update m_mcc_records[].m_offset_array and m_decorrelation_array
             * to point to the new addresses */
            if (new_mct_records != l_tcp->m_mct_records) {
                for (i = 0; i < l_tcp->m_nb_mcc_records; ++i) {
                    opj_simple_mcc_decorrelation_data_t* l_mcc_record =
                        &(l_tcp->m_mcc_records[i]);
                    if (l_mcc_record->m_decorrelation_array) {
                        l_mcc_record->m_decorrelation_array =
                            new_mct_records +
                            (l_mcc_record->m_decorrelation_array -
                             l_tcp->m_mct_records);
                    }
                    if (l_mcc_record->m_offset_array) {
                        l_mcc_record->m_offset_array =
                            new_mct_records +
                            (l_mcc_record->m_offset_array -
                             l_tcp->m_mct_records);
                    }
                }
            }

            l_tcp->m_mct_records = new_mct_records;
            l_mct_data = l_tcp->m_mct_records + l_tcp->m_nb_mct_records;
            memset(l_mct_data, 0, (l_tcp->m_nb_max_mct_records - l_tcp->m_nb_mct_records) *
                   sizeof(opj_mct_data_t));
        }

        l_mct_data = l_tcp->m_mct_records + l_tcp->m_nb_mct_records;
        ++l_tcp->m_nb_mct_records;
    }

    if (l_mct_data->m_data) {
        opj_free(l_mct_data->m_data);
        l_mct_data->m_data = 00;
        l_mct_data->m_data_size = 0;
    }

    l_mct_data->m_index = l_indix;
    l_mct_data->m_array_type = (J2K_MCT_ARRAY_TYPE)((l_tmp  >> 8) & 3);
    l_mct_data->m_element_type = (J2K_MCT_ELEMENT_TYPE)((l_tmp  >> 10) & 3);

    opj_read_bytes(p_header_data, &l_tmp, 2);                       /* Ymct */
    p_header_data += 2;
    if (l_tmp != 0) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Cannot take in charge multiple MCT markers\n");
        return OPJ_TRUE;
    }

    p_header_size -= 6;

    l_mct_data->m_data = (OPJ_BYTE*)opj_malloc(p_header_size);
    if (! l_mct_data->m_data) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCT marker\n");
        return OPJ_FALSE;
    }
    memcpy(l_mct_data->m_data, p_header_data, p_header_size);

    l_mct_data->m_data_size = p_header_size;

    return OPJ_TRUE;
}